

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nghttp2_hd.c
# Opt level: O0

void nghttp2_hd_entry_init(nghttp2_hd_entry *ent,nghttp2_hd_nv *nv)

{
  uint8_t uVar1;
  undefined3 uVar2;
  nghttp2_hd_nv *nv_local;
  nghttp2_hd_entry *ent_local;
  
  (ent->nv).name = nv->name;
  (ent->nv).value = nv->value;
  uVar1 = nv->flags;
  uVar2 = *(undefined3 *)&nv->field_0x15;
  (ent->nv).token = nv->token;
  (ent->nv).flags = uVar1;
  *(undefined3 *)&(ent->nv).field_0x15 = uVar2;
  (ent->cnv).name = nv->name->base;
  (ent->cnv).namelen = nv->name->len;
  (ent->cnv).value = nv->value->base;
  (ent->cnv).valuelen = nv->value->len;
  (ent->cnv).flags = nv->flags;
  ent->next = (nghttp2_hd_entry *)0x0;
  ent->hash = 0;
  nghttp2_rcbuf_incref((ent->nv).name);
  nghttp2_rcbuf_incref((ent->nv).value);
  return;
}

Assistant:

void nghttp2_hd_entry_init(nghttp2_hd_entry *ent, nghttp2_hd_nv *nv) {
  ent->nv = *nv;
  ent->cnv.name = nv->name->base;
  ent->cnv.namelen = nv->name->len;
  ent->cnv.value = nv->value->base;
  ent->cnv.valuelen = nv->value->len;
  ent->cnv.flags = nv->flags;
  ent->next = NULL;
  ent->hash = 0;

  nghttp2_rcbuf_incref(ent->nv.name);
  nghttp2_rcbuf_incref(ent->nv.value);
}